

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O3

int dodiscovered(void)

{
  nh_menuitem *pnVar1;
  char let;
  short sVar2;
  char *pcVar3;
  char *pcVar4;
  objclass *poVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  menulist menu;
  char classes [18];
  char buf [256];
  menulist local_178;
  int local_164;
  char *local_160;
  char local_158 [32];
  char local_138 [264];
  
  init_menulist(&local_178);
  lVar8 = (long)local_178.size;
  if (local_178.size <= local_178.icount) {
    local_178.size = local_178.size * 2;
    local_178.items = (nh_menuitem *)realloc(local_178.items,lVar8 * 0x218);
  }
  lVar8 = (long)local_178.icount;
  local_178.items[lVar8].id = 0;
  local_178.items[lVar8].role = MI_TEXT;
  local_178.items[lVar8].accel = '\0';
  local_178.items[lVar8].group_accel = '\0';
  local_178.items[lVar8].selected = '\0';
  builtin_strncpy(local_178.items[lVar8].caption,"Discover",8);
  builtin_strncpy(local_178.items[lVar8].caption + 8,"ies",4);
  local_178.icount = local_178.icount + 1;
  lVar8 = (long)local_178.size;
  if (local_178.size <= local_178.icount) {
    local_178.size = local_178.size * 2;
    local_178.items = (nh_menuitem *)realloc(local_178.items,lVar8 * 0x218);
  }
  lVar8 = (long)local_178.icount;
  local_178.items[lVar8].accel = '\0';
  local_178.items[lVar8].group_accel = '\0';
  local_178.items[lVar8].selected = '\0';
  local_178.items[lVar8].caption[0] = '\0';
  local_178.items[lVar8].id = 0;
  local_178.items[lVar8].role = MI_TEXT;
  iVar7 = local_178.icount + 1;
  lVar8 = 0;
  iVar11 = 0;
  iVar10 = 0;
  poVar5 = objects;
  local_178.icount = iVar7;
  do {
    sVar2 = *(short *)((long)uniq_objs + lVar8);
    if ((poVar5[sVar2].field_0x10 & 1) != 0) {
      if (iVar11 == 0) {
        lVar9 = (long)local_178.size;
        if (local_178.size <= iVar7) {
          local_178.size = local_178.size * 2;
          local_178.items = (nh_menuitem *)realloc(local_178.items,lVar9 * 0x218);
          iVar7 = local_178.icount;
        }
        local_178.items[iVar7].id = 0;
        local_178.items[iVar7].role = MI_HEADING;
        local_178.items[iVar7].accel = '\0';
        local_178.items[iVar7].group_accel = '\0';
        local_178.items[iVar7].selected = '\0';
        builtin_strncpy(local_178.items[iVar7].caption,"Unique I",8);
        builtin_strncpy(local_178.items[iVar7].caption + 5,"e Items",8);
        local_178.icount = local_178.icount + 1;
        poVar5 = objects;
      }
      sprintf(local_138,"  %s",obj_descr[poVar5[sVar2].oc_name_idx].oc_name);
      lVar9 = (long)local_178.size;
      if (local_178.size <= local_178.icount) {
        local_178.size = local_178.size * 2;
        local_178.items = (nh_menuitem *)realloc(local_178.items,lVar9 * 0x218);
      }
      iVar11 = iVar11 + 1;
      pnVar1 = local_178.items + local_178.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_138);
      iVar7 = local_178.icount + 1;
      iVar10 = iVar10 + 1;
      poVar5 = objects;
      local_178.icount = iVar7;
    }
    lVar8 = lVar8 + 2;
  } while (lVar8 != 8);
  iVar7 = disp_artifact_discoveries(&local_178);
  pcVar4 = local_158;
  strcpy(pcVar4,flags.inv_order);
  pcVar3 = strchr(pcVar4,0x11);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = eos(local_158);
    pcVar3[0] = '\x11';
    pcVar3[1] = '\0';
  }
  iVar7 = iVar7 + iVar10;
  poVar5 = objects;
  let = local_158[0];
  do {
    objects = poVar5;
    if (let == '\0') {
      if (iVar7 == 0) {
        pline("You haven\'t discovered anything yet...");
      }
      else {
        display_menu(local_178.items,local_178.icount,(char *)0x0,0,(int *)0x0);
      }
      free(local_178.items);
      return 0;
    }
    lVar8 = (long)bases[let];
    local_160 = pcVar4;
    if (lVar8 < 0x21a) {
      cVar6 = let + '\x01';
      lVar9 = lVar8 * 0x14;
      do {
        lVar12 = lVar8 + 1;
        if ((&poVar5->oc_class)[lVar9 * 2] != let) break;
        iVar10 = (int)(&spl_book[0x2c].sp_id)[lVar8];
        if (((&spl_book[0x2c].sp_id)[lVar8] != 0) &&
           ((poVar5[iVar10].oc_uname != (char *)0x0 ||
            (((poVar5[iVar10].field_0x10 & 1) != 0 &&
             (obj_descr[poVar5[iVar10].oc_descr_idx].oc_descr != (char *)0x0)))))) {
          local_164 = iVar7;
          if (let != cVar6) {
            lVar8 = (long)local_178.size;
            if (local_178.size <= local_178.icount) {
              local_178.size = local_178.size * 2;
              local_178.items = (nh_menuitem *)realloc(local_178.items,lVar8 * 0x218);
            }
            pnVar1 = local_178.items + local_178.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_HEADING;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            pcVar4 = let_to_name(let,'\0');
            strcpy(pnVar1->caption,pcVar4);
            local_178.icount = local_178.icount + 1;
            poVar5 = objects;
          }
          pcVar4 = "*";
          if ((poVar5[iVar10].field_0x10 & 8) == 0) {
            pcVar4 = " ";
          }
          pcVar3 = obj_typename(iVar10);
          sprintf(local_138,"%s %s",pcVar4,pcVar3);
          lVar8 = (long)local_178.size;
          if (local_178.size <= local_178.icount) {
            local_178.size = local_178.size * 2;
            local_178.items = (nh_menuitem *)realloc(local_178.items,lVar8 * 0x218);
          }
          iVar7 = local_164 + 1;
          pnVar1 = local_178.items + local_178.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          local_178.icount = local_178.icount + 1;
          poVar5 = objects;
          cVar6 = let;
        }
        lVar9 = lVar9 + 0x14;
        lVar8 = lVar12;
      } while ((int)lVar12 != 0x21a);
    }
    let = local_160[1];
    pcVar4 = local_160 + 1;
    poVar5 = objects;
  } while( true );
}

Assistant:

int dodiscovered(void)
{
    int i, dis;
    int	ct = 0;
    char *s, oclass, prev_class, classes[MAXOCLASSES];
    struct menulist menu;
    char buf[BUFSZ];

    init_menulist(&menu);
    add_menutext(&menu, "Discoveries");
    add_menutext(&menu, "");

    /* gather "unique objects" into a pseudo-class; note that they'll
       also be displayed individually within their regular class */
    for (i = dis = 0; i < SIZE(uniq_objs); i++)
	if (objects[uniq_objs[i]].oc_name_known) {
	    if (!dis++)
		add_menuheading(&menu, "Unique Items");
	    sprintf(buf, "  %s", OBJ_NAME(objects[uniq_objs[i]]));
	    add_menutext(&menu, buf);
	    ++ct;
	}
    /* display any known artifacts as another pseudo-class */
    ct += disp_artifact_discoveries(&menu);

    /* several classes are omitted from packorder; one is of interest here */
    strcpy(classes, flags.inv_order);
    if (!strchr(classes, VENOM_CLASS)) {
	s = eos(classes);
	*s++ = VENOM_CLASS;
	*s = '\0';
    }

    for (s = classes; *s; s++) {
	oclass = *s;
	prev_class = oclass + 1;	/* forced different from oclass */
	for (i = bases[(int)oclass];
	     i < NUM_OBJECTS && objects[i].oc_class == oclass; i++) {
	    if ((dis = disco[i]) && interesting_to_discover(dis)) {
		ct++;
		if (oclass != prev_class) {
		    add_menuheading(&menu, let_to_name(oclass, FALSE));
		    prev_class = oclass;
		}
		sprintf(buf, "%s %s",(objects[dis].oc_pre_discovered ? "*" : " "),
				obj_typename(dis));
		add_menutext(&menu, buf);
	    }
	}
    }
    if (ct == 0) {
	pline("You haven't discovered anything yet...");
    } else
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    free(menu.items);

    return 0;
}